

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

void __thiscall
ser::OffsetTable::AddFieldRecord
          (OffsetTable *this,int savepointID,string *fieldName,offset_t offset,checksum_t *checksum)

{
  size_type sVar1;
  ostream *poVar2;
  SerializationException *this_00;
  mapped_type *this_01;
  undefined1 local_230 [8];
  OffsetTableEntryValue value;
  OffsetTableEntry *entry;
  undefined1 local_1e0 [8];
  SerializationException exception;
  ostringstream local_1a8 [8];
  ostringstream msg;
  checksum_t *checksum_local;
  offset_t offset_local;
  string *fieldName_local;
  int savepointID_local;
  OffsetTable *this_local;
  
  sVar1 = std::
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
          ::size(&this->entries_);
  if (sVar1 <= (uint)savepointID) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"Error: savepoint with ID ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,savepointID);
    poVar2 = std::operator<<(poVar2," is not registered in table\n");
    poVar2 = std::operator<<(poVar2,"Saving the field ");
    poVar2 = std::operator<<(poVar2,(string *)fieldName);
    poVar2 = std::operator<<(poVar2," at offset ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,offset);
    std::operator<<(poVar2," is not possible\n");
    SerializationException::SerializationException((SerializationException *)local_1e0);
    std::__cxx11::ostringstream::str();
    SerializationException::Init((SerializationException *)local_1e0,(string *)&entry);
    std::__cxx11::string::~string((string *)&entry);
    this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(this_00,(SerializationException *)local_1e0);
    __cxa_throw(this_00,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  value.checksum.field_2._8_8_ =
       std::
       vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
       ::operator[](&this->entries_,(long)savepointID);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>
  ::anon_struct_40_2_0ce26ee9_for_second::OffsetTableEntryValue
            ((anon_struct_40_2_0ce26ee9_for_second *)local_230);
  local_230 = (undefined1  [8])offset;
  std::__cxx11::string::operator=((string *)&value,(string *)checksum);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
                          *)value.checksum.field_2._8_8_,fieldName);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>
  ::anon_struct_40_2_0ce26ee9_for_second::operator=
            (this_01,(anon_struct_40_2_0ce26ee9_for_second *)local_230);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>
  ::anon_struct_40_2_0ce26ee9_for_second::~OffsetTableEntryValue
            ((anon_struct_40_2_0ce26ee9_for_second *)local_230);
  return;
}

Assistant:

void OffsetTable::AddFieldRecord(int savepointID, const std::string& fieldName,
                                 offset_t offset, const checksum_t& checksum)
{
    // Check that ID is valid
    if (static_cast<unsigned>(savepointID) >= entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: savepoint with ID " << savepointID << " is not registered in table\n"
            << "Saving the field " << fieldName << " at offset " << offset << " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Find the right row of the table
    OffsetTableEntry& entry = entries_[savepointID];

    // Set the offset of the record
    // If the recod already exists, it is overwritten
    OffsetTableEntryValue value;
    value.offset = offset;
    value.checksum = checksum;
    entry[fieldName] = value;
}